

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void worker_thread_run(mg_connection *conn)

{
  mg_context *ctx_00;
  uint16_t uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  time_t tVar5;
  uint16_t local_48;
  uint16_t local_44;
  undefined4 local_40 [2];
  mg_workerTLS tls;
  int thread_index;
  mg_context *ctx;
  mg_connection *conn_local;
  
  ctx_00 = conn->phys_ctx;
  mg_set_thread_name("worker");
  local_40[0] = 0;
  uVar3 = mg_atomic_inc(&thread_idx_max);
  tls._0_8_ = uVar3 & 0xffffffff;
  pthread_setspecific(sTlsKey,local_40);
  if ((ctx_00->callbacks).init_thread == (_func_void_ptr_mg_context_ptr_int *)0x0) {
    tls.thread_idx = 0;
  }
  else {
    tls.thread_idx = (unsigned_long)(*(ctx_00->callbacks).init_thread)(ctx_00,1);
  }
  uVar3 = ((long)conn - (long)ctx_00->worker_connections) / 0x9e8;
  tls.alpn_proto._4_4_ = (uint)uVar3;
  if (((int)tls.alpn_proto._4_4_ < 0) || (ctx_00->cfg_worker_threads <= tls.alpn_proto._4_4_)) {
    mg_cry_internal_wrap
              ((mg_connection *)0x0,ctx_00,"worker_thread_run",0x4d19,
               "Internal error: Invalid worker index %i",uVar3 & 0xffffffff);
  }
  else {
    pcVar4 = (char *)mg_malloc((ulong)ctx_00->max_request_size);
    conn->buf = pcVar4;
    if (conn->buf == (char *)0x0) {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,ctx_00,"worker_thread_run",0x4d25,
                 "Out of memory: Cannot allocate buffer for worker %i",(ulong)tls.alpn_proto._4_4_);
    }
    else {
      conn->buf_size = ctx_00->max_request_size;
      conn->dom_ctx = &ctx_00->dd;
      conn->tls_user_ptr = (void *)tls.thread_idx;
      (conn->request_info).user_data = ctx_00->user_data;
      iVar2 = pthread_mutex_init((pthread_mutex_t *)&conn->mutex,
                                 (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar2 == 0) {
        while (iVar2 = consume_socket(ctx_00,&conn->client,tls.alpn_proto._4_4_), iVar2 != 0) {
          tls.user_ptr = (void *)0x0;
          tVar5 = time((time_t *)0x0);
          conn->conn_birth_time = tVar5;
          if ((conn->client).rsa.sa.sa_family == 10) {
            local_44 = (conn->client).rsa.sin.sin_port;
          }
          else {
            local_44 = (conn->client).rsa.sin.sin_port;
          }
          uVar1 = ntohs(local_44);
          (conn->request_info).remote_port = (uint)uVar1;
          if ((conn->client).lsa.sa.sa_family == 10) {
            local_48 = (conn->client).lsa.sin.sin_port;
          }
          else {
            local_48 = (conn->client).lsa.sin.sin_port;
          }
          uVar1 = ntohs(local_48);
          (conn->request_info).server_port = (uint)uVar1;
          sockaddr_to_string((conn->request_info).remote_addr,0x30,&(conn->client).rsa);
          (conn->request_info).is_ssl = (uint)(conn->client).is_ssl;
          if ((conn->client).is_ssl == '\0') {
            init_connection(conn);
            conn->connection_type = 1;
            conn->protocol_type = 0;
            process_new_connection(conn);
          }
        }
        if ((ctx_00->callbacks).exit_thread != (_func_void_mg_context_ptr_int_void_ptr *)0x0) {
          (*(ctx_00->callbacks).exit_thread)(ctx_00,1,(void *)tls.thread_idx);
        }
        pthread_setspecific(sTlsKey,(void *)0x0);
        pthread_mutex_destroy((pthread_mutex_t *)&conn->mutex);
        conn->buf_size = 0;
        mg_free(conn->buf);
        conn->buf = (char *)0x0;
        if ((conn->request_info).local_uri != (conn->request_info).local_uri_raw) {
          mg_free((conn->request_info).local_uri);
          (conn->request_info).local_uri = (char *)0x0;
        }
      }
      else {
        mg_free(conn->buf);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,ctx_00,"worker_thread_run",0x4d34,"%s","Cannot create mutex"
                  );
      }
    }
  }
  return;
}

Assistant:

static void
worker_thread_run(struct mg_connection *conn)
{
	struct mg_context *ctx = conn->phys_ctx;
	int thread_index;
	struct mg_workerTLS tls;

	mg_set_thread_name("worker");

	tls.is_master = 0;
	tls.thread_idx = (unsigned)mg_atomic_inc(&thread_idx_max);
#if defined(_WIN32)
	tls.pthread_cond_helper_mutex = CreateEvent(NULL, FALSE, FALSE, NULL);
#endif

	/* Initialize thread local storage before calling any callback */
	pthread_setspecific(sTlsKey, &tls);

	/* Check if there is a user callback */
	if (ctx->callbacks.init_thread) {
		/* call init_thread for a worker thread (type 1), and store the
		 * return value */
		tls.user_ptr = ctx->callbacks.init_thread(ctx, 1);
	} else {
		/* No callback: set user pointer to NULL */
		tls.user_ptr = NULL;
	}

	/* Connection structure has been pre-allocated */
	thread_index = (int)(conn - ctx->worker_connections);
	if ((thread_index < 0)
	    || ((unsigned)thread_index >= (unsigned)ctx->cfg_worker_threads)) {
		mg_cry_ctx_internal(ctx,
		                    "Internal error: Invalid worker index %i",
		                    thread_index);
		return;
	}

	/* Request buffers are not pre-allocated. They are private to the
	 * request and do not contain any state information that might be
	 * of interest to anyone observing a server status.  */
	conn->buf = (char *)mg_malloc_ctx(ctx->max_request_size, conn->phys_ctx);
	if (conn->buf == NULL) {
		mg_cry_ctx_internal(
		    ctx,
		    "Out of memory: Cannot allocate buffer for worker %i",
		    thread_index);
		return;
	}
	conn->buf_size = (int)ctx->max_request_size;

	conn->dom_ctx = &(ctx->dd); /* Use default domain and default host */

	conn->tls_user_ptr = tls.user_ptr; /* store ptr for quick access */

	conn->request_info.user_data = ctx->user_data;
	/* Allocate a mutex for this connection to allow communication both
	 * within the request handler and from elsewhere in the application
	 */
	if (0 != pthread_mutex_init(&conn->mutex, &pthread_mutex_attr)) {
		mg_free(conn->buf);
		mg_cry_ctx_internal(ctx, "%s", "Cannot create mutex");
		return;
	}

#if defined(USE_SERVER_STATS)
	conn->conn_state = 1; /* not consumed */
#endif

	/* Call consume_socket() even when ctx->stop_flag > 0, to let it
	 * signal sq_empty condvar to wake up the master waiting in
	 * produce_socket() */
	while (consume_socket(ctx, &conn->client, thread_index)) {

		/* New connections must start with new protocol negotiation */
		tls.alpn_proto = NULL;

#if defined(USE_SERVER_STATS)
		conn->conn_close_time = 0;
#endif
		conn->conn_birth_time = time(NULL);

		/* Fill in IP, port info early so even if SSL setup below fails,
		 * error handler would have the corresponding info.
		 * Thanks to Johannes Winkelmann for the patch.
		 */
		conn->request_info.remote_port =
		    ntohs(USA_IN_PORT_UNSAFE(&conn->client.rsa));

		conn->request_info.server_port =
		    ntohs(USA_IN_PORT_UNSAFE(&conn->client.lsa));

		sockaddr_to_string(conn->request_info.remote_addr,
		                   sizeof(conn->request_info.remote_addr),
		                   &conn->client.rsa);

		DEBUG_TRACE("Incoming %sconnection from %s",
		            (conn->client.is_ssl ? "SSL " : ""),
		            conn->request_info.remote_addr);

		conn->request_info.is_ssl = conn->client.is_ssl;

		if (conn->client.is_ssl) {

#if defined(USE_MBEDTLS)
			/* HTTPS connection */
			if (mbed_ssl_accept(&(conn->ssl),
			                    conn->dom_ctx->ssl_ctx,
			                    (int *)&(conn->client.sock),
			                    conn->phys_ctx)
			    == 0) {
				/* conn->dom_ctx is set in get_request */
				/* process HTTPS connection */
				init_connection(conn);
				conn->connection_type = CONNECTION_TYPE_REQUEST;
				conn->protocol_type = PROTOCOL_TYPE_HTTP1;
				process_new_connection(conn);
			} else {
				/* make sure the connection is cleaned up on SSL failure */
				close_connection(conn);
			}

#elif !defined(NO_SSL)
			/* HTTPS connection */
			if (sslize(conn, SSL_accept, NULL)) {
				/* conn->dom_ctx is set in get_request */

				/* Get SSL client certificate information (if set) */
				struct mg_client_cert client_cert;
				if (ssl_get_client_cert_info(conn, &client_cert)) {
					conn->request_info.client_cert = &client_cert;
				}

				/* process HTTPS connection */
#if defined(USE_HTTP2)
				if ((tls.alpn_proto != NULL)
				    && (!memcmp(tls.alpn_proto, "\x02h2", 3))) {
					/* process HTTPS/2 connection */
					init_connection(conn);
					conn->connection_type = CONNECTION_TYPE_REQUEST;
					conn->protocol_type = PROTOCOL_TYPE_HTTP2;
					conn->content_len =
					    -1;               /* content length is not predefined */
					conn->is_chunked = 0; /* HTTP2 is never chunked */
					process_new_http2_connection(conn);
				} else
#endif
				{
					/* process HTTPS/1.x or WEBSOCKET-SECURE connection */
					init_connection(conn);
					conn->connection_type = CONNECTION_TYPE_REQUEST;
					/* Start with HTTP, WS will be an "upgrade" request later */
					conn->protocol_type = PROTOCOL_TYPE_HTTP1;
					process_new_connection(conn);
				}

				/* Free client certificate info */
				if (conn->request_info.client_cert) {
					mg_free((void *)(conn->request_info.client_cert->subject));
					mg_free((void *)(conn->request_info.client_cert->issuer));
					mg_free((void *)(conn->request_info.client_cert->serial));
					mg_free((void *)(conn->request_info.client_cert->finger));
					/* Free certificate memory */
					X509_free(
					    (X509 *)conn->request_info.client_cert->peer_cert);
					conn->request_info.client_cert->peer_cert = 0;
					conn->request_info.client_cert->subject = 0;
					conn->request_info.client_cert->issuer = 0;
					conn->request_info.client_cert->serial = 0;
					conn->request_info.client_cert->finger = 0;
					conn->request_info.client_cert = 0;
				}
			} else {
				/* make sure the connection is cleaned up on SSL failure */
				close_connection(conn);
			}
#endif

		} else {
			/* process HTTP connection */
			init_connection(conn);
			conn->connection_type = CONNECTION_TYPE_REQUEST;
			/* Start with HTTP, WS will be an "upgrade" request later */
			conn->protocol_type = PROTOCOL_TYPE_HTTP1;
			process_new_connection(conn);
		}

		DEBUG_TRACE("%s", "Connection closed");

#if defined(USE_SERVER_STATS)
		conn->conn_close_time = time(NULL);
#endif
	}

	/* Call exit thread user callback */
	if (ctx->callbacks.exit_thread) {
		ctx->callbacks.exit_thread(ctx, 1, tls.user_ptr);
	}

	/* delete thread local storage objects */
	pthread_setspecific(sTlsKey, NULL);
#if defined(_WIN32)
	CloseHandle(tls.pthread_cond_helper_mutex);
#endif
	pthread_mutex_destroy(&conn->mutex);

	/* Free the request buffer. */
	conn->buf_size = 0;
	mg_free(conn->buf);
	conn->buf = NULL;

	/* Free cleaned URI (if any) */
	if (conn->request_info.local_uri != conn->request_info.local_uri_raw) {
		mg_free((void *)conn->request_info.local_uri);
		conn->request_info.local_uri = NULL;
	}

#if defined(USE_SERVER_STATS)
	conn->conn_state = 9; /* done */
#endif

	DEBUG_TRACE("%s", "exiting");
}